

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O1

bool __thiscall dxil_spv::Converter::Impl::emit_execution_modes_domain(Impl *this)

{
  MetadataKind MVar1;
  uint uVar2;
  Builder *this_00;
  MDNode *node;
  Function *entryPoint;
  LoggingCallback p_Var3;
  void *pvVar4;
  byte bVar5;
  char buffer [4096];
  Capability local_1028 [3];
  undefined3 uStack_101b;
  undefined5 uStack_1018;
  char acStack_1013 [4083];
  
  this_00 = SPIRVModule::get_builder(this->spirv_module);
  local_1028[0] = 3;
  std::
  _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
  ::_M_insert_unique<spv::Capability_const&>
            ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
              *)&this_00->capabilities,local_1028);
  node = (MDNode *)get_shader_property_tag(this->entry_point_meta,DSState);
  if (node != (MDNode *)0x0) {
    MVar1 = LLVMBC::MDOperand::get_metadata_kind((MDOperand *)node);
    if (MVar1 != Node) {
      p_Var3 = get_thread_log_callback();
      if (p_Var3 != (LoggingCallback)0x0) {
        uStack_1018 = 0x6163206e69;
        builtin_strncpy(acStack_1013,"st<T>.\n",8);
        local_1028._0_8_ = 0x2064696c61766e49;
        stack0xffffffffffffefe0 = 0x2065707974;
        uStack_101b = 0x204449;
        pvVar4 = get_thread_log_callback_userdata();
        (*p_Var3)(pvVar4,Error,(char *)local_1028);
        std::terminate();
      }
      emit_execution_modes_domain();
      std::terminate();
    }
    uVar2 = get_constant_metadata<unsigned_int>(node,0);
    entryPoint = SPIRVModule::get_entry_function(this->spirv_module);
    bVar5 = (char)uVar2 - 1;
    if (bVar5 < 3) {
      spv::Builder::addExecutionMode
                (this_00,entryPoint,*(ExecutionMode *)(&DAT_001c2650 + (ulong)bVar5 * 4),-1,-1,-1);
      uVar2 = get_constant_metadata<unsigned_int>(node,1);
      (this->execution_mode_meta).stage_input_num_vertex = uVar2;
      return true;
    }
    p_Var3 = get_thread_log_callback();
    if (p_Var3 == (LoggingCallback)0x0) {
      emit_execution_modes_domain();
    }
    else {
      uStack_1018 = 0x6420726f74;
      builtin_strncpy(acStack_1013,"omain!\n",8);
      local_1028._0_8_ = 0x206e776f6e6b6e55;
      stack0xffffffffffffefe0 = 0x6573736574;
      uStack_101b = 0x616c6c;
      pvVar4 = get_thread_log_callback_userdata();
      (*p_Var3)(pvVar4,Error,(char *)local_1028);
    }
  }
  return false;
}

Assistant:

bool Converter::Impl::emit_execution_modes_domain()
{
	auto &builder = spirv_module.get_builder();
	builder.addCapability(spv::CapabilityTessellation);

	auto *ds_state_node = get_shader_property_tag(entry_point_meta, DXIL::ShaderPropertyTag::DSState);
	if (ds_state_node)
	{
		auto *arguments = llvm::cast<llvm::MDNode>(*ds_state_node);
		auto domain = static_cast<DXIL::TessellatorDomain>(get_constant_metadata(arguments, 0));
		auto *func = spirv_module.get_entry_function();

		switch (domain)
		{
		case DXIL::TessellatorDomain::IsoLine:
			builder.addExecutionMode(func, spv::ExecutionModeIsolines);
			break;

		case DXIL::TessellatorDomain::Tri:
			builder.addExecutionMode(func, spv::ExecutionModeTriangles);
			break;

		case DXIL::TessellatorDomain::Quad:
			builder.addExecutionMode(func, spv::ExecutionModeQuads);
			break;

		default:
			LOGE("Unknown tessellator domain!\n");
			return false;
		}

		unsigned input_control_points = get_constant_metadata(arguments, 1);
		execution_mode_meta.stage_input_num_vertex = input_control_points;
		return true;
	}
	else
		return false;
}